

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O1

void __thiscall
embree::sse2::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_>::RefBuilderSmall::
attachBuildRefs(RefBuilderSmall *this,
               BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  FastAllocator *this_00;
  long *plVar1;
  pointer *pppTVar2;
  atomic<int> *paVar3;
  undefined4 *puVar4;
  BuildRef *pBVar5;
  Vec3fx *pVVar6;
  int iVar7;
  uint uVar8;
  float fVar9;
  Geometry *pGVar10;
  BVH *pBVar11;
  MutexSys *this_01;
  iterator __position;
  Ref<embree::Geometry> *pRVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  BuildRef *pBVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  float fVar24;
  undefined8 uVar25;
  MutexSys *this_02;
  ulong uVar26;
  float *pfVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  float *pfVar31;
  long lVar32;
  size_t size;
  ulong uVar33;
  Lock<embree::MutexSys> lock;
  vuint<4> vgeomID;
  Vec3vf<4> v1;
  Vec3vf<4> v2;
  vuint<4> vprimID;
  PrimInfo pinfo;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  ulong local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  PrimRef *local_110;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  RefBuilderSmall *local_d8;
  long *local_d0;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  float local_98 [4];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  long local_48;
  long local_40;
  
  pGVar10 = (topBuilder->scene->geometries).items[this->objectID_].ptr;
  uVar8 = pGVar10->numPrimitives;
  uVar33 = CONCAT44(0,uVar8);
  lVar29 = *(long *)&(topBuilder->scene->super_AccelN).field_0x188;
  local_130._0_8_ = lVar29 + 0x550;
  if (lVar29 == 0) {
    local_130._0_8_ = (MemoryMonitorInterface *)0x0;
  }
  local_130[8] = false;
  local_120 = (undefined1  [16])0x0;
  local_110 = (PrimRef *)0x0;
  local_d8 = this;
  if (uVar33 != 0) {
    size = uVar33 << 5;
    (**((MemoryMonitorInterface *)local_130._0_8_)->_vptr_MemoryMonitorInterface)
              (local_130._0_8_,size,0);
    if (uVar8 < 0xe0000) {
      local_110 = (PrimRef *)alignedMalloc(size,0x20);
    }
    else {
      local_110 = (PrimRef *)os_malloc(size,(bool *)(local_130 + 8));
    }
    local_120._8_4_ = uVar8;
    local_120._0_8_ = uVar33;
    local_120._12_4_ = 0;
  }
  sse2::createPrimRefArray
            ((PrimInfo *)&local_88.field_1,pGVar10,(uint)local_d8->objectID_,uVar33,
             (mvector<PrimRef> *)local_130,
             &(topBuilder->bvh->scene->progressInterface).super_BuildProgressMonitor);
  if (local_40 != local_48) {
    local_d0 = (long *)__tls_get_addr(&PTR_02224d38);
    uVar33 = 0;
    do {
      pBVar11 = topBuilder->bvh;
      this_02 = (MutexSys *)*local_d0;
      if (this_02 == (MutexSys *)0x0) {
        this_02 = (MutexSys *)alignedMalloc(0xc0,0x40);
        MutexSys::MutexSys(this_02);
        this_02[1].mutex = (void *)0x0;
        this_02[8].mutex = this_02;
        *(undefined1 (*) [16])(this_02 + 9) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(this_02 + 0xb) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(this_02 + 0xd) = (undefined1  [16])0x0;
        this_02[0x10].mutex = this_02;
        *(undefined1 (*) [16])(this_02 + 0x11) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(this_02 + 0x13) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(this_02 + 0x15) = (undefined1  [16])0x0;
        *local_d0 = (long)this_02;
        fStack_170._0_1_ = 1;
        local_178 = (undefined1  [8])&FastAllocator::s_thread_local_allocators_lock;
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        local_108 = (undefined1  [8])this_02;
        std::
        vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
        ::
        emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                  ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                    *)FastAllocator::s_thread_local_allocators,
                   (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                    *)local_108);
        if ((__uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
             )local_108 !=
            (__uniq_ptr_impl<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
             )0x0) {
          std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                    ((default_delete<embree::FastAllocator::ThreadLocal2> *)local_108,
                     (ThreadLocal2 *)local_108);
        }
        if (fStack_170._0_1_ == '\x01') {
          MutexSys::unlock((MutexSys *)local_178);
        }
      }
      this_00 = &pBVar11->alloc;
      uVar28 = (ulong)(((pBVar11->alloc).use_single_mode ^ 1) << 6);
      local_148 = 0xb0;
      this_01 = *(MutexSys **)((long)&this_02[8].mutex + uVar28);
      if (this_00 != (FastAllocator *)this_01[1].mutex) {
        fStack_100._0_1_ = 1;
        local_108 = (undefined1  [8])this_01;
        MutexSys::lock(this_01);
        if (this_01[1].mutex != (void *)0x0) {
          LOCK();
          plVar1 = (long *)((long)this_01[1].mutex + 0x118);
          *plVar1 = *plVar1 + (long)this_01[0x15].mutex + (long)this_01[0xd].mutex;
          UNLOCK();
          LOCK();
          plVar1 = (long *)((long)this_01[1].mutex + 0x120);
          *plVar1 = *plVar1 + (((long)this_01[0xb].mutex + (long)this_01[0x13].mutex) -
                              ((long)this_01[10].mutex + (long)this_01[0x12].mutex));
          UNLOCK();
          LOCK();
          plVar1 = (long *)((long)this_01[1].mutex + 0x128);
          *plVar1 = *plVar1 + (long)this_01[0x16].mutex + (long)this_01[0xe].mutex;
          UNLOCK();
        }
        *(undefined1 (*) [16])(this_01 + 0xd) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(this_01 + 0xb) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(this_01 + 9) = (undefined1  [16])0x0;
        this_01[0xc].mutex = (void *)(pBVar11->alloc).defaultBlockSize;
        *(undefined1 (*) [16])(this_01 + 0x11) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(this_01 + 0x13) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(this_01 + 0x15) = (undefined1  [16])0x0;
        this_01[0x14].mutex = (void *)(pBVar11->alloc).defaultBlockSize;
        LOCK();
        this_01[1].mutex = this_00;
        UNLOCK();
        local_c8 = (undefined1  [8])this_01;
        fStack_170._0_1_ = 1;
        local_178 = (undefined1  [8])&FastAllocator::s_thread_local_allocators_lock;
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        __position._M_current =
             (pBVar11->alloc).thread_local_allocators.
             super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pBVar11->alloc).thread_local_allocators.
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
          ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                    ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                      *)&(pBVar11->alloc).thread_local_allocators,__position,
                     (ThreadLocal2 **)local_c8);
        }
        else {
          *__position._M_current = (ThreadLocal2 *)local_c8;
          pppTVar2 = &(pBVar11->alloc).thread_local_allocators.
                      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar2 = *pppTVar2 + 1;
        }
        if (fStack_170._0_1_ == '\x01') {
          MutexSys::unlock((MutexSys *)local_178);
        }
        if (fStack_100._0_1_ == '\x01') {
          MutexSys::unlock((MutexSys *)local_108);
        }
      }
      plVar1 = (long *)((long)&this_02[0xd].mutex + uVar28);
      *plVar1 = *plVar1 + local_148;
      lVar29 = *(long *)((long)&this_02[10].mutex + uVar28);
      uVar30 = (ulong)(-(int)lVar29 & 0xf);
      uVar26 = lVar29 + local_148 + uVar30;
      *(ulong *)((long)&this_02[10].mutex + uVar28) = uVar26;
      if (*(ulong *)((long)&this_02[0xb].mutex + uVar28) < uVar26) {
        *(long *)((long)&this_02[10].mutex + uVar28) = lVar29;
        uVar26 = *(ulong *)((long)&this_02[0xc].mutex + uVar28);
        if (uVar26 < local_148 << 2) {
          pfVar27 = (float *)FastAllocator::malloc(this_00,(size_t)&local_148);
        }
        else {
          local_178 = (undefined1  [8])uVar26;
          pfVar27 = (float *)FastAllocator::malloc(this_00,(size_t)local_178);
          *(float **)((long)&this_02[9].mutex + uVar28) = pfVar27;
          lVar29 = (*(long *)((long)&this_02[0xb].mutex + uVar28) -
                   *(long *)((long)&this_02[10].mutex + uVar28)) +
                   *(long *)((long)&this_02[0xe].mutex + uVar28);
          *(long *)((long)&this_02[0xe].mutex + uVar28) = lVar29;
          *(undefined8 *)((long)&this_02[10].mutex + uVar28) = 0;
          *(undefined1 (*) [8])((long)&this_02[0xb].mutex + uVar28) = local_178;
          *(ulong *)((long)&this_02[10].mutex + uVar28) = local_148;
          if ((ulong)local_178 < local_148) {
            *(undefined8 *)((long)&this_02[10].mutex + uVar28) = 0;
            local_178 = (undefined1  [8])*(undefined8 *)((long)&this_02[0xc].mutex + uVar28);
            pfVar27 = (float *)FastAllocator::malloc(this_00,(size_t)local_178);
            *(float **)((long)&this_02[9].mutex + uVar28) = pfVar27;
            lVar29 = (*(long *)((long)&this_02[0xb].mutex + uVar28) -
                     *(long *)((long)&this_02[10].mutex + uVar28)) +
                     *(long *)((long)&this_02[0xe].mutex + uVar28);
            *(long *)((long)&this_02[0xe].mutex + uVar28) = lVar29;
            *(undefined8 *)((long)&this_02[10].mutex + uVar28) = 0;
            *(undefined1 (*) [8])((long)&this_02[0xb].mutex + uVar28) = local_178;
            *(ulong *)((long)&this_02[10].mutex + uVar28) = local_148;
            if ((ulong)local_178 < local_148) {
              *(undefined8 *)((long)&this_02[10].mutex + uVar28) = 0;
              pfVar27 = (float *)0x0;
              goto LAB_00d8a3f8;
            }
          }
          *(long *)((long)&this_02[0xe].mutex + uVar28) = lVar29;
        }
      }
      else {
        plVar1 = (long *)((long)&this_02[0xe].mutex + uVar28);
        *plVar1 = *plVar1 + uVar30;
        pfVar27 = (float *)((uVar26 - local_148) + *(long *)((long)&this_02[9].mutex + uVar28));
      }
LAB_00d8a3f8:
      uVar28 = local_40 - local_48;
      local_148 = 0xffffffffffffffff;
      uStack_140 = 0xffffffff;
      uStack_13c = 0xffffffff;
      local_98[0] = -NAN;
      local_98[1] = -NAN;
      local_98[2] = -NAN;
      local_98[3] = -NAN;
      _local_158 = (undefined1  [16])0x0;
      _local_168 = (undefined1  [16])0x0;
      _local_178 = (undefined1  [16])0x0;
      _local_e8 = (undefined1  [16])0x0;
      _local_f8 = (undefined1  [16])0x0;
      _local_108 = (undefined1  [16])0x0;
      _local_a8 = (undefined1  [16])0x0;
      _local_b8 = (undefined1  [16])0x0;
      _local_c8 = (undefined1  [16])0x0;
      if (uVar33 < uVar28) {
        pRVar12 = (topBuilder->bvh->scene->geometries).items;
        pfVar31 = local_110[uVar33].upper.field_0.m128 + 3;
        uVar26 = 0;
        do {
          fVar9 = *pfVar31;
          pGVar10 = pRVar12[(uint)pfVar31[-4]].ptr;
          lVar32 = (ulong)(uint)fVar9 *
                   pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar29 = *(long *)&pGVar10->field_0x58;
          lVar13 = *(long *)&pGVar10[1].time_range.upper;
          p_Var14 = pGVar10[1].intersectionFilterN;
          puVar4 = (undefined4 *)(lVar13 + (ulong)*(uint *)(lVar29 + lVar32) * (long)p_Var14);
          uVar16 = *puVar4;
          uVar17 = puVar4[1];
          uVar18 = puVar4[2];
          puVar4 = (undefined4 *)(lVar13 + (ulong)*(uint *)(lVar29 + 4 + lVar32) * (long)p_Var14);
          uVar19 = *puVar4;
          uVar20 = puVar4[1];
          uVar21 = puVar4[2];
          puVar4 = (undefined4 *)(lVar13 + (ulong)*(uint *)(lVar29 + 8 + lVar32) * (long)p_Var14);
          uVar22 = *puVar4;
          uVar23 = puVar4[1];
          fVar24 = (float)puVar4[2];
          *(float *)((long)&local_148 + uVar26 * 4) = pfVar31[-4];
          local_98[uVar26] = fVar9;
          *(undefined4 *)(local_178 + uVar26 * 4) = uVar16;
          *(undefined4 *)(local_168 + uVar26 * 4) = uVar17;
          *(undefined4 *)(local_158 + uVar26 * 4) = uVar18;
          *(undefined4 *)(local_108 + uVar26 * 4) = uVar19;
          *(undefined4 *)(local_f8 + uVar26 * 4) = uVar20;
          *(undefined4 *)(local_e8 + uVar26 * 4) = uVar21;
          *(undefined4 *)(local_c8 + uVar26 * 4) = uVar22;
          *(undefined4 *)(local_b8 + uVar26 * 4) = uVar23;
          local_98[uVar26 - 4] = fVar24;
          uVar30 = uVar26 + 1;
          if (2 < uVar26) break;
          lVar29 = uVar26 + uVar33;
          pfVar31 = pfVar31 + 8;
          uVar26 = uVar30;
        } while (lVar29 + 1U < uVar28);
        uVar33 = uVar33 + uVar30;
      }
      *pfVar27 = (float)local_178._0_4_;
      pfVar27[1] = (float)local_178._4_4_;
      pfVar27[2] = fStack_170;
      pfVar27[3] = fStack_16c;
      pfVar27[4] = (float)local_168._0_4_;
      pfVar27[5] = (float)local_168._4_4_;
      pfVar27[6] = fStack_160;
      pfVar27[7] = fStack_15c;
      pfVar27[8] = (float)local_158._0_4_;
      pfVar27[9] = (float)local_158._4_4_;
      pfVar27[10] = fStack_150;
      pfVar27[0xb] = fStack_14c;
      pfVar27[0xc] = (float)local_178._0_4_ - (float)local_108._0_4_;
      pfVar27[0xd] = (float)local_178._4_4_ - (float)local_108._4_4_;
      pfVar27[0xe] = fStack_170 - fStack_100;
      pfVar27[0xf] = fStack_16c - fStack_fc;
      pfVar27[0x10] = (float)local_168._0_4_ - (float)local_f8._0_4_;
      pfVar27[0x11] = (float)local_168._4_4_ - (float)local_f8._4_4_;
      pfVar27[0x12] = fStack_160 - fStack_f0;
      pfVar27[0x13] = fStack_15c - fStack_ec;
      pfVar27[0x14] = (float)local_158._0_4_ - (float)local_e8._0_4_;
      pfVar27[0x15] = (float)local_158._4_4_ - (float)local_e8._4_4_;
      pfVar27[0x16] = fStack_150 - fStack_e0;
      pfVar27[0x17] = fStack_14c - fStack_dc;
      pfVar27[0x18] = (float)local_c8._0_4_ - (float)local_178._0_4_;
      pfVar27[0x19] = (float)local_c8._4_4_ - (float)local_178._4_4_;
      pfVar27[0x1a] = fStack_c0 - fStack_170;
      pfVar27[0x1b] = fStack_bc - fStack_16c;
      pfVar27[0x1c] = (float)local_b8._0_4_ - (float)local_168._0_4_;
      pfVar27[0x1d] = (float)local_b8._4_4_ - (float)local_168._4_4_;
      pfVar27[0x1e] = fStack_b0 - fStack_160;
      pfVar27[0x1f] = fStack_ac - fStack_15c;
      pfVar27[0x20] = (float)local_a8._0_4_ - (float)local_158._0_4_;
      pfVar27[0x21] = (float)local_a8._4_4_ - (float)local_158._4_4_;
      pfVar27[0x22] = fStack_a0 - fStack_150;
      pfVar27[0x23] = fStack_9c - fStack_14c;
      *(ulong *)(pfVar27 + 0x24) = local_148;
      *(ulong *)(pfVar27 + 0x26) = CONCAT44(uStack_13c,uStack_140);
      *(ulong *)(pfVar27 + 0x28) = CONCAT44(local_98[1],local_98[0]);
      *(ulong *)(pfVar27 + 0x2a) = CONCAT44(local_98[3],local_98[2]);
      fVar9 = *(float *)&local_d8->objectID_;
      LOCK();
      paVar3 = &topBuilder->nextRef;
      iVar7 = (paVar3->super___atomic_base<int>)._M_i;
      (paVar3->super___atomic_base<int>)._M_i = (paVar3->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      pBVar15 = (topBuilder->refs).items;
      pBVar5 = pBVar15 + iVar7;
      (pBVar5->super_PrimRef).lower.field_0.m128[0] = local_88.m128[0];
      (pBVar5->super_PrimRef).lower.field_0.m128[1] = local_88.m128[1];
      (pBVar5->super_PrimRef).lower.field_0.m128[2] = local_88.m128[2];
      (pBVar5->super_PrimRef).lower.field_0.m128[3] = fVar9;
      pVVar6 = &pBVar15[iVar7].super_PrimRef.upper;
      (pVVar6->field_0).m128[0] = local_78;
      (pVVar6->field_0).m128[1] = fStack_74;
      (pVVar6->field_0).m128[2] = fStack_70;
      (pVVar6->field_0).m128[3] = 1.4013e-45;
      pBVar15[iVar7].node.ptr = (ulong)pfVar27 | 9;
      pBVar15[iVar7].bounds_area = 0.0;
    } while (uVar33 < (ulong)(local_40 - local_48));
  }
  uVar25 = local_120._8_8_;
  if (local_110 != (PrimRef *)0x0) {
    if ((ulong)(local_120._8_8_ << 5) < 0x1c00000) {
      alignedFree(local_110);
    }
    else {
      os_free(local_110,local_120._8_8_ << 5,local_130[8]);
    }
  }
  if (uVar25 != 0) {
    (***(_func_int ***)local_130._0_8_)(local_130._0_8_,uVar25 * -0x20,1);
  }
  return;
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder) {

          Mesh* mesh = topBuilder->scene->template getSafe<Mesh>(objectID_);
          size_t meshSize = mesh->size();
          assert(isSmallGeometry(mesh));
          
          mvector<PrimRef> prefs(topBuilder->scene->device, meshSize);
          auto pinfo = createPrimRefArray(mesh,objectID_,meshSize,prefs,topBuilder->bvh->scene->progressInterface);

          size_t begin=0;
          while (begin < pinfo.size())
          {
            Primitive* accel = (Primitive*) topBuilder->bvh->alloc.getCachedAllocator().malloc1(sizeof(Primitive),BVH::byteAlignment);
            typename BVH::NodeRef node = BVH::encodeLeaf((char*)accel,1);
            accel->fill(prefs.data(),begin,pinfo.size(),topBuilder->bvh->scene);
            
            /* create build primitive */
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node,(unsigned int)objectID_,1);
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node);
#endif
          }
          assert(begin == pinfo.size());
        }